

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_wrapper.cpp
# Opt level: O2

ssize_t __thiscall
YAML::ostream_wrapper::write(ostream_wrapper *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  void *extraout_RAX;
  void *extraout_RAX_00;
  undefined4 in_register_00000034;
  long *plVar5;
  ulong __new_size;
  long lVar6;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  if (this->m_pStream == (ostream *)0x0) {
    __new_size = (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    uVar4 = this->m_pos + plVar5[1] + 1;
    if (__new_size <= uVar4) {
      __new_size = uVar4;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,__new_size);
    pvVar3 = extraout_RAX;
    if (plVar5[1] != 0) {
      pvVar3 = memmove((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + this->m_pos,(void *)*plVar5,plVar5[1]);
    }
  }
  else {
    pvVar3 = (void *)std::ostream::write((char *)this->m_pStream,*plVar5);
  }
  lVar1 = *plVar5;
  lVar2 = plVar5[1];
  for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
    update_pos(this,*(char *)(lVar1 + lVar6));
    pvVar3 = extraout_RAX_00;
  }
  return (ssize_t)pvVar3;
}

Assistant:

void ostream_wrapper::write(const std::string& str) {
  if (m_pStream) {
    m_pStream->write(str.c_str(), str.size());
  } else {
    m_buffer.resize(std::max(m_buffer.size(), m_pos + str.size() + 1));
    std::copy(str.begin(), str.end(), m_buffer.begin() + m_pos);
  }

  for (char ch : str) {
    update_pos(ch);
  }
}